

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Exe.cpp
# Opt level: O3

int __thiscall
amrex::parser_local_symbol_index
          (amrex *this,parser_symbol *sym,Vector<char_*,_std::allocator<char_*>_> *param_2)

{
  int iVar1;
  ulong uVar2;
  pointer *pppcVar3;
  parser_symbol *ppVar4;
  parser_symbol *ppVar5;
  long lVar6;
  char *pcVar7;
  pointer *pppcVar8;
  
  uVar2 = (long)param_2 - (long)sym;
  lVar6 = (long)uVar2 >> 5;
  pppcVar3 = (pointer *)param_2;
  if (0 < lVar6) {
    pcVar7 = *(char **)(this + 8);
    ppVar4 = (parser_symbol *)((long)param_2 - (uVar2 & 0xffffffffffffffe0));
    pppcVar3 = (pointer *)((long)param_2 + lVar6 * -0x20);
    pppcVar8 = &param_2[-1].super_vector<char_*,_std::allocator<char_*>_>.
                super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
                _M_finish;
    lVar6 = lVar6 + 1;
    do {
      iVar1 = strcmp(pcVar7,(char *)*(pointer *)&((parser_symbol *)param_2)[-1].ip);
      ppVar5 = (parser_symbol *)param_2;
      if (iVar1 == 0) goto LAB_00721d75;
      iVar1 = strcmp(pcVar7,(char *)*pppcVar8);
      if (iVar1 == 0) {
        ppVar5 = (parser_symbol *)&((parser_symbol *)param_2)[-1].ip;
        goto LAB_00721d75;
      }
      iVar1 = strcmp(pcVar7,(char *)((_Vector_impl_data *)(pppcVar8 + -1))->_M_start);
      if (iVar1 == 0) {
        ppVar5 = (parser_symbol *)&((parser_symbol *)param_2)[-1].name;
        goto LAB_00721d75;
      }
      iVar1 = strcmp(pcVar7,(char *)pppcVar8[-2]);
      if (iVar1 == 0) {
        ppVar5 = (parser_symbol *)param_2 + -1;
        goto LAB_00721d75;
      }
      param_2 = (Vector<char_*,_std::allocator<char_*>_> *)&((parser_symbol *)param_2)[-2].ip;
      pppcVar8 = pppcVar8 + -4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
    uVar2 = (long)ppVar4 - (long)sym;
    param_2 = (Vector<char_*,_std::allocator<char_*>_> *)ppVar4;
  }
  lVar6 = (long)uVar2 >> 3;
  if (lVar6 == 3) {
    pcVar7 = *(char **)(this + 8);
    iVar1 = strcmp(pcVar7,(char *)*(pointer *)&((parser_symbol *)param_2)[-1].ip);
    ppVar5 = (parser_symbol *)param_2;
    if (iVar1 == 0) goto LAB_00721d75;
    param_2 = (Vector<char_*,_std::allocator<char_*>_> *)(pppcVar3 + -1);
    pppcVar3 = (pointer *)param_2;
LAB_00721d3c:
    iVar1 = strcmp(pcVar7,(char *)*(pointer *)&((parser_symbol *)param_2)[-1].ip);
    ppVar5 = (parser_symbol *)param_2;
    if (iVar1 == 0) goto LAB_00721d75;
    param_2 = (Vector<char_*,_std::allocator<char_*>_> *)(pppcVar3 + -1);
  }
  else {
    if (lVar6 == 2) {
      pcVar7 = *(char **)(this + 8);
      goto LAB_00721d3c;
    }
    ppVar5 = sym;
    if (lVar6 != 1) goto LAB_00721d75;
    pcVar7 = *(char **)(this + 8);
  }
  iVar1 = strcmp(pcVar7,(char *)*(pointer *)&((parser_symbol *)param_2)[-1].ip);
  ppVar5 = (parser_symbol *)param_2;
  if (iVar1 != 0) {
    ppVar5 = sym;
  }
LAB_00721d75:
  iVar1 = -1;
  if (ppVar5 != sym) {
    iVar1 = (int)((ulong)((long)ppVar5 - (long)sym) >> 3) + -1;
  }
  return iVar1;
}

Assistant:

static int parser_local_symbol_index (struct parser_symbol* sym, Vector<char*>& local_variables)
{
    auto r = std::find_if(local_variables.rbegin(), local_variables.rend(),
                          [=] (char* i) { return std::strcmp(sym->name, i) == 0; });
    if (r != local_variables.rend()) {
        return std::distance(r, local_variables.rend()) - 1;
    } else {
        return -1;
    }
}